

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.cpp
# Opt level: O1

void rasterize(vector<Shape,_std::allocator<Shape>_> *shapes,char *file_name,size_t width,
              size_t height)

{
  _Base_ptr *pp_Var1;
  RasterizeLine **__src;
  pointer pEVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  pointer pSVar8;
  undefined4 uVar11;
  size_t sVar9;
  Shape *pSVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t sVar14;
  int iVar15;
  pointer __n;
  pointer pRVar16;
  Shape *pSVar17;
  RasterizeLine **ppRVar18;
  Shape *pSVar19;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  _Var20;
  Segment *s;
  pointer pSVar21;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  __last;
  Shape *shape;
  RasterizeLine *pRVar22;
  iterator __position;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  pointer pEVar27;
  pointer pRVar28;
  pointer pRVar29;
  ulong uVar30;
  size_t __n_00;
  pointer pSVar31;
  _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  *this;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  _Var32;
  bool bVar33;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
  __comp;
  undefined8 uVar34;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
  _Var35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  ShapeMap shapes_1;
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  lines;
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  events;
  Pixmap pixmap;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_1f8;
  pointer local_1e8;
  RasterizeLine **local_1d0;
  pointer local_1c8;
  undefined1 local_1a8 [8];
  Shape local_1a0;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
  local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  float fStack_160;
  float fStack_15c;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined8 local_148;
  float fStack_140;
  float fStack_13c;
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  local_138;
  size_t local_118;
  Type local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  local_e8;
  Pixmap local_c8;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  size_t local_90;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_88;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_80;
  ulong local_78;
  undefined1 local_70 [8];
  int local_68;
  char *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_138.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar17 = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_168 = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_148 = (pointer)width;
  local_118 = height;
  local_60 = file_name;
  if (pSVar17 != local_168) {
    do {
      pSVar8 = (pSVar17->segments).super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar21 = (pSVar17->segments).super__Vector_base<Segment,_std::allocator<Segment>_>.
                     _M_impl.super__Vector_impl_data._M_start; pSVar21 != pSVar8;
          pSVar21 = pSVar21 + 1) {
        pSVar31 = (pointer)(((long)local_138.
                                   super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_138.
                                   super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
        local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pSVar17;
        if (pSVar21->y1 < pSVar21->y0 || pSVar21->y1 == pSVar21->y0) {
          local_1a8 = *(undefined1 (*) [8])&pSVar21->line;
          local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_1a0.segments.
                                 super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,-1);
          std::
          vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
          ::push_back(&local_138,(value_type *)local_1a8);
          local_1a8 = (undefined1  [8])((ulong)(uint)pSVar21->y1 << 0x20);
          local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar31;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_e8,(value_type *)local_1a8);
          local_1a8._4_4_ = pSVar21->y0;
          local_1a8._0_4_ = 1.4013e-45;
          local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar31;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_e8,(value_type *)local_1a8);
        }
        else {
          local_1a8 = *(undefined1 (*) [8])&pSVar21->line;
          local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_1a0.segments.
                                 super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,1);
          std::
          vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
          ::push_back(&local_138,(value_type *)local_1a8);
          local_1a8 = (undefined1  [8])((ulong)(uint)pSVar21->y0 << 0x20);
          local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar31;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_e8,(value_type *)local_1a8);
          local_1a8._4_4_ = pSVar21->y1;
          local_1a8._0_4_ = 1.4013e-45;
          local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar31;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_e8,(value_type *)local_1a8);
        }
      }
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != local_168);
  }
  pRVar28 = local_148;
  std::vector<Color,_std::allocator<Color>_>::vector
            (&local_c8.pixels,local_118 * (long)local_148,(allocator_type *)local_1a8);
  local_c8.width = (size_t)pRVar28;
  if (local_e8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __comp._M_comp.y = (anon_class_4_1_54a39819)0.0;
  }
  else {
    __comp._M_comp.y =
         (anon_class_4_1_54a39819)
         (local_e8.c.
          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
          ._M_impl.super__Vector_impl_data._M_start)->y;
  }
  uVar44 = 0;
  uVar43 = 0;
  uVar42 = 0;
  if (local_e8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1d0 = (RasterizeLine **)0x0;
    local_1f8._M_current = (RasterizeLine **)0x0;
  }
  else {
    local_1f8._M_current = (RasterizeLine **)0x0;
    _Var32._M_current = (RasterizeLine **)0x0;
    local_1d0 = (RasterizeLine **)0x0;
    do {
      local_10c = (local_e8.c.
                   super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type;
      fVar4 = (local_e8.c.
               super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
               ._M_impl.super__Vector_impl_data._M_start)->y;
      local_90 = (local_e8.c.
                  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start)->index;
      if (0x10 < (long)local_e8.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e8.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
        uVar7 = local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].type;
        uVar11 = local_e8.c.
                 super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].y;
        sVar9 = local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].index;
        fVar45 = (local_e8.c.
                  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start)->y;
        sVar14 = (local_e8.c.
                  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start)->index;
        local_e8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].type =
             (local_e8.c.
              super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
              ._M_impl.super__Vector_impl_data._M_start)->type;
        local_e8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].y = fVar45;
        local_e8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].index = sVar14;
        uVar25 = (long)local_e8.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (-0x10 - (long)local_e8.c.
                                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        lVar26 = (long)uVar25 >> 4;
        if (lVar26 < 3) {
          lVar23 = 0;
        }
        else {
          lVar24 = 0;
          do {
            lVar3 = lVar24 * 2 + 2;
            lVar23 = lVar24 * 2 + 1;
            if (local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3].y <
                local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar23].y ||
                local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3].y ==
                local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar23].y) {
              lVar23 = lVar3;
            }
            pEVar2 = local_e8.c.
                     super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar23;
            fVar45 = pEVar2->y;
            sVar14 = pEVar2->index;
            pEVar27 = local_e8.c.
                      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar24;
            pEVar27->type = pEVar2->type;
            pEVar27->y = fVar45;
            pEVar27->index = sVar14;
            lVar24 = lVar23;
          } while (lVar23 < (lVar26 - (lVar26 + -1 >> 0x3f)) + -1 >> 1);
        }
        lVar24 = lVar23;
        if (((uVar25 & 0x10) == 0) && (lVar23 == lVar26 + -2 >> 1)) {
          lVar24 = lVar23 * 2 + 1;
          pEVar2 = local_e8.c.
                   super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar24;
          fVar45 = pEVar2->y;
          sVar14 = pEVar2->index;
          pEVar27 = local_e8.c.
                    super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23;
          pEVar27->type = pEVar2->type;
          pEVar27->y = fVar45;
          pEVar27->index = sVar14;
        }
        if (0 < lVar24) {
          do {
            lVar26 = (lVar24 - (lVar24 + -1 >> 0x3f)) + -1 >> 1;
            if (local_e8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar26].y <= (float)uVar11) break;
            pEVar27 = local_e8.c.
                      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar26;
            fVar45 = pEVar27->y;
            sVar14 = pEVar27->index;
            pEVar2 = local_e8.c.
                     super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar24;
            pEVar2->type = pEVar27->type;
            pEVar2->y = fVar45;
            pEVar2->index = sVar14;
            bVar33 = 2 < lVar24;
            lVar24 = lVar26;
          } while (bVar33);
        }
        local_e8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar24].type = uVar7;
        local_e8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar24].y = (float)uVar11;
        local_e8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar24].index = sVar9;
      }
      local_e8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_e8.c.
           super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      if ((float)__comp._M_comp.y < fVar4) {
        local_50 = (long)_Var32._M_current - (long)local_1f8._M_current;
        local_78 = (long)_Var32._M_current - (long)local_1f8._M_current >> 3;
        lVar26 = 0x3f;
        if (local_78 != 0) {
          for (; local_78 >> lVar26 == 0; lVar26 = lVar26 + -1) {
          }
        }
        local_58 = (ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e;
        local_88._M_current = local_1f8._M_current + 0x10;
        local_80._M_current = _Var32._M_current;
        do {
          _Var32._M_current = local_80._M_current;
          local_178._M_comp.y = __comp._M_comp.y;
          uStack_174 = uVar42;
          uStack_170 = uVar43;
          uStack_16c = uVar44;
          if (local_1f8._M_current != local_80._M_current) {
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                      (local_1f8,local_80,local_58,__comp);
            _Var20._M_current = local_88._M_current;
            if (local_50 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                        (local_1f8,_Var32,local_178);
            }
            else {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                        (local_1f8,local_88,local_178);
              __last._M_current = local_88._M_current;
              while (_Var20._M_current != _Var32._M_current) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                          (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                                   )local_178._M_comp.y);
                __last._M_current = __last._M_current + 1;
                _Var20._M_current = __last._M_current;
              }
            }
          }
          __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)fVar4;
          if (1 < local_78) {
            uVar25 = 1;
            fVar45 = fVar4;
            do {
              fVar38 = (local_1f8._M_current[uVar25 - 1]->super_Line).m;
              fVar40 = (local_1f8._M_current[uVar25]->super_Line).m;
              if (((fVar38 != fVar40) ||
                  (__comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)fVar45,
                  NAN(fVar38) || NAN(fVar40))) &&
                 (__comp._M_comp.y =
                       (anon_class_4_1_54a39819)
                       (((local_1f8._M_current[uVar25]->super_Line).x0 -
                        (local_1f8._M_current[uVar25 - 1]->super_Line).x0) / (fVar38 - fVar40)),
                 (float)__comp._M_comp.y <= (float)local_178._M_comp.y ||
                 fVar45 <= (float)__comp._M_comp.y)) {
                __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)fVar45;
              }
              uVar25 = uVar25 + 1;
              fVar45 = (float)__comp._M_comp.y;
            } while (local_78 != uVar25);
          }
          uVar42 = 0;
          uVar44 = 0;
          uVar43 = 0;
          local_158 = (float)__comp._M_comp.y;
          uStack_154 = 0;
          uStack_150 = 0;
          uStack_14c = 0;
          _Var35 = local_178;
          if (local_1f8._M_current == _Var32._M_current) {
            local_1c8 = (pointer)0x0;
            pRVar28 = (pointer)0x0;
            local_1e8 = (pointer)0x0;
          }
          else {
            local_1c8 = (pointer)0x0;
            pRVar28 = (pointer)0x0;
            local_1e8 = (pointer)0x0;
            __n = (pointer)0x0;
            _Var20._M_current = local_1f8._M_current;
            do {
              pSVar17 = (Shape *)*_Var20._M_current;
              if (pRVar28 == local_1c8) {
                lVar26 = (long)pRVar28 - (long)__n;
                local_168 = pSVar17;
                if (lVar26 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar30 = (lVar26 >> 3) * -0x5555555555555555;
                uVar25 = uVar30;
                if (pRVar28 == __n) {
                  uVar25 = 1;
                }
                this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                        *)(uVar25 + uVar30);
                if ((_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                     *)0x555555555555554 < this) {
                  this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          *)0x555555555555555;
                }
                if (CARRY8(uVar25,uVar30)) {
                  this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          *)0x555555555555555;
                }
                local_148 = __n;
                __n = std::
                      _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                      ::_M_allocate(this,(size_t)__n);
                *(pointer *)((long)__n + lVar26 + 0x10) =
                     (local_168->segments).super__Vector_base<Segment,_std::allocator<Segment>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                pSVar21 = (local_168->segments).
                          super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                *(undefined8 *)((long)__n + lVar26) =
                     (local_168->segments).super__Vector_base<Segment,_std::allocator<Segment>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                ((undefined8 *)((long)__n + lVar26))[1] = pSVar21;
                pRVar29 = __n;
                for (pRVar16 = local_148; pRVar28 != pRVar16; pRVar16 = pRVar16 + 1) {
                  pRVar29->shape = pRVar16->shape;
                  iVar15 = pRVar16->direction;
                  uVar42 = *(undefined4 *)&pRVar16->field_0xc;
                  pRVar29->super_Line = pRVar16->super_Line;
                  pRVar29->direction = iVar15;
                  *(undefined4 *)&pRVar29->field_0xc = uVar42;
                  pRVar29 = pRVar29 + 1;
                }
                if (local_148 != (pointer)0x0) {
                  operator_delete(local_148,(long)local_1c8 - (long)local_148);
                }
                local_1c8 = __n + (long)this;
                _Var32._M_current = local_80._M_current;
                _Var35._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_178;
                __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_158;
                uVar42 = uStack_154;
                uVar43 = uStack_150;
                uVar44 = uStack_14c;
                local_1e8 = __n;
              }
              else {
                pRVar28->shape =
                     (Shape *)(pSVar17->segments).
                              super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                pSVar21 = (pSVar17->segments).super__Vector_base<Segment,_std::allocator<Segment>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                pRVar28->super_Line =
                     (Line)(pSVar17->segments).super__Vector_base<Segment,_std::allocator<Segment>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                *(pointer *)&pRVar28->direction = pSVar21;
                pRVar29 = pRVar28;
              }
              pRVar28 = pRVar29 + 1;
              _Var20._M_current = _Var20._M_current + 1;
            } while (_Var20._M_current != _Var32._M_current);
          }
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_c8.width;
          auVar13._8_8_ = 0;
          auVar13._0_8_ =
               (long)local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4;
          uVar25 = SUB168(auVar13 / auVar12,0);
          if ((long)uVar25 < 0) {
            fVar45 = (float)((ulong)(SUB164(auVar13 / auVar12,0) & 1) | uVar25 >> 1);
            fVar45 = fVar45 + fVar45;
          }
          else {
            fVar45 = (float)(long)uVar25;
          }
          fVar38 = 0.0;
          if (0.0 <= (float)_Var35._M_comp.y) {
            fVar38 = (float)_Var35._M_comp.y;
          }
          uVar25 = (long)(fVar38 - 9.223372e+18) & (long)fVar38 >> 0x3f | (long)fVar38;
          fVar40 = (float)uVar25;
          fVar38 = fVar45 + -0.5;
          if ((float)__comp._M_comp.y <= fVar45 + -0.5) {
            fVar38 = (float)__comp._M_comp.y;
          }
          if (fVar40 < fVar38) {
            uVar30 = ((long)pRVar28 - (long)local_1e8 >> 3) * -0x5555555555555555;
            local_40 = uVar30;
            local_108 = fVar38;
            do {
              local_48 = uVar25 + 1;
              local_38 = uVar25;
              fVar45 = (float)(uVar25 + 1);
              local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_1a0.segments.
                                    super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                    super__Vector_impl_data._M_start & 0xffffffff00000000);
              local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1a0.paint.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_1a0.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_1a0;
              local_1a0.paint.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_1a0;
              if (1 < uVar30) {
                local_a8 = (float)local_178;
                if ((float)local_178._M_comp.y <= fVar40) {
                  local_a8 = fVar40;
                }
                if (fVar45 <= (float)__comp._M_comp.y) {
                  __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)fVar45;
                }
                uStack_a4 = uStack_174;
                uStack_a0 = uStack_170;
                uStack_9c = uStack_16c;
                fVar38 = (float)__comp._M_comp.y - local_a8;
                local_100 = fVar40 + 0.5;
                uVar25 = 1;
                do {
                  pSVar17 = local_1e8[uVar25 - 1].shape;
                  pSVar19 = &local_1a0;
                  for (pSVar10 = (Shape *)local_1a0.segments.
                                          super__Vector_base<Segment,_std::allocator<Segment>_>.
                                          _M_impl.super__Vector_impl_data._M_finish;
                      pSVar10 != (Shape *)0x0;
                      pSVar10 = (Shape *)(&(pSVar10->segments).
                                           super__Vector_base<Segment,_std::allocator<Segment>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage)
                                         [bVar33]) {
                    bVar33 = (Shape *)(pSVar10->paint).
                                      super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi < pSVar17;
                    if (!bVar33) {
                      pSVar19 = pSVar10;
                    }
                  }
                  __position._M_node = (_Base_ptr)&local_1a0;
                  if ((pSVar19 != &local_1a0) &&
                     (__position._M_node = (_Base_ptr)pSVar19,
                     pSVar17 < (Shape *)(pSVar19->paint).
                                        super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)) {
                    __position._M_node = (_Base_ptr)&local_1a0;
                  }
                  if ((Shape *)__position._M_node == &local_1a0) {
                    local_70 = (undefined1  [8])pSVar17;
                    local_68 = local_1e8[uVar25 - 1].direction;
                    std::
                    _Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                    ::_M_emplace_unique<std::pair<Shape_const*,int>>
                              ((_Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                                *)local_1a8,(pair<const_Shape_*,_int> *)local_70);
                  }
                  else {
                    pp_Var1 = &__position._M_node[1]._M_parent;
                    *(int *)pp_Var1 = *(int *)pp_Var1 + local_1e8[uVar25 - 1].direction;
                    if (*(int *)pp_Var1 == 0) {
                      std::
                      _Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                      ::erase_abi_cxx11_((_Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                                          *)local_1a8,__position);
                    }
                  }
                  if (local_1a0.paint.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    fVar40 = local_1e8[uVar25 - 1].super_Line.m;
                    fVar39 = local_1e8[uVar25 - 1].super_Line.x0;
                    fVar36 = fVar40 * local_a8 + fVar39;
                    fVar39 = fVar40 * (float)__comp._M_comp.y + fVar39;
                    fVar40 = fVar39;
                    if (fVar36 <= fVar39) {
                      fVar40 = fVar36;
                    }
                    fVar37 = 0.0;
                    if (0.0 <= fVar40) {
                      fVar37 = fVar40;
                    }
                    uVar30 = (long)(fVar37 - 9.223372e+18) & (long)fVar37 >> 0x3f | (long)fVar37;
                    fVar46 = (float)uVar30;
                    fVar37 = local_1e8[uVar25].super_Line.m;
                    fVar50 = local_1e8[uVar25].super_Line.x0;
                    fVar41 = fVar37 * local_a8 + fVar50;
                    fVar50 = fVar37 * (float)__comp._M_comp.y + fVar50;
                    fVar37 = fVar41;
                    if (fVar41 <= fVar50) {
                      fVar37 = fVar50;
                    }
                    fVar47 = (float)local_c8.width + -0.5;
                    if (fVar37 <= (float)local_c8.width + -0.5) {
                      fVar47 = fVar37;
                    }
                    if (fVar46 < fVar47) {
                      local_fc = fVar36;
                      if (fVar36 <= fVar39) {
                        local_fc = fVar39;
                      }
                      if (fVar41 <= fVar50) {
                        fVar50 = fVar41;
                      }
                      fVar41 = (local_fc - fVar40) / fVar38;
                      fVar48 = fVar40 - fVar41 * local_a8;
                      local_104 = fVar39 + fVar36;
                      fVar39 = (fVar37 - fVar50) / fVar38;
                      fVar36 = fVar50 - fVar39 * local_a8;
                      local_f0 = fVar47;
                      local_f4 = fVar50;
                      local_f8 = fVar37;
                      do {
                        fVar37 = (float)(uVar30 + 1);
                        local_ec = fVar38;
                        if (fVar46 < local_fc) {
                          if (fVar40 <= fVar46) {
                            fVar50 = (((local_fc + fVar46) - fVar46) - fVar46) *
                                     ((float)__comp._M_comp.y - (fVar46 - fVar48) / fVar41);
                          }
                          else {
                            fVar50 = ((local_104 - fVar46) - fVar46) * fVar38;
                          }
                          local_ec = fVar50 * -0.5 + fVar38;
                          if (fVar37 < local_fc) {
                            local_ec = local_ec +
                                       (((local_fc + fVar37) - fVar37) - fVar37) *
                                       ((float)__comp._M_comp.y - (fVar37 - fVar48) / fVar41) * 0.5;
                          }
                        }
                        if (local_f4 < fVar37) {
                          if (fVar37 <= local_f8) {
                            fVar50 = (((fVar37 + fVar37) - local_f4) - fVar37) *
                                     ((fVar37 - fVar36) / fVar39 - local_a8);
                          }
                          else {
                            fVar50 = (((fVar37 + fVar37) - local_f4) - local_f8) * fVar38;
                          }
                          local_ec = local_ec + fVar50 * -0.5;
                          if (local_f4 < fVar46) {
                            local_ec = local_ec +
                                       (((fVar46 + fVar46) - local_f4) - fVar46) *
                                       ((fVar46 - fVar36) / fVar39 - local_a8) * 0.5;
                          }
                        }
                        local_118 = CONCAT44(local_118._4_4_,fVar37);
                        local_70._4_4_ = local_100;
                        local_70._0_4_ = fVar46 + 0.5;
                        if ((Shape *)local_1a0.segments.
                                     super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage == &local_1a0) {
                          fVar37 = 0.0;
                          fVar50 = 0.0;
                          fVar46 = 0.0;
                          fVar47 = 0.0;
                        }
                        else {
                          local_148._0_4_ = 0.0;
                          local_148._4_4_ = 0.0;
                          fStack_140 = 0.0;
                          fStack_13c = 0.0;
                          fStack_160 = 0.0;
                          fStack_15c = 0.0;
                          pSVar17 = (Shape *)local_1a0.segments.
                                             super__Vector_base<Segment,_std::allocator<Segment>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                          fVar37 = 0.0;
                          fVar50 = 0.0;
                          do {
                            fVar46 = fStack_160;
                            fStack_160 = fStack_140;
                            fVar47 = fStack_15c;
                            fStack_15c = fStack_13c;
                            fStack_140 = fVar46;
                            fStack_13c = fVar47;
                            local_168._4_4_ = local_148._4_4_;
                            local_168._0_4_ = (float)local_148;
                            local_148._0_4_ = fVar37;
                            local_148._4_4_ = fVar50;
                            uVar34 = (**(code **)**(undefined8 **)
                                                   &(pSVar17->paint).
                                                                                                        
                                                  super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi[1]._M_use_count)();
                            fStack_140 = local_168._4_4_;
                            fVar46 = 1.0 - fVar50;
                            fVar49 = (float)local_168 * fVar46;
                            fVar47 = local_168._4_4_ * fVar46;
                            fStack_15c = (float)((ulong)uVar34 >> 0x20);
                            local_168 = (Shape *)CONCAT44(fStack_15c + local_148._4_4_ * fVar46,
                                                          (float)local_148 * fVar46 + (float)uVar34)
                            ;
                            fStack_160 = local_148._4_4_;
                            local_148 = (pointer)CONCAT44(fVar47 + fVar50,fVar49 + fVar37);
                            fStack_13c = fStack_140;
                            pSVar17 = (Shape *)std::_Rb_tree_increment
                                                         ((_Rb_tree_node_base *)pSVar17);
                            fVar37 = (float)local_168;
                            fVar50 = local_168._4_4_;
                            fVar46 = (float)local_148;
                            fVar47 = local_148._4_4_;
                          } while (pSVar17 != &local_1a0);
                        }
                        lVar26 = local_c8.width * local_38;
                        fVar49 = local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar26 + uVar30].g;
                        fVar5 = local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar26 + uVar30].b;
                        fVar6 = local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar26 + uVar30].a;
                        local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26 + uVar30].r =
                             local_ec * fVar37 +
                             local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar26 + uVar30].r;
                        local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26 + uVar30].g =
                             fVar50 * local_ec + fVar49;
                        local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26 + uVar30].b =
                             local_ec * fVar46 + fVar5;
                        local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26 + uVar30].a =
                             fVar47 * local_ec + fVar6;
                        uVar30 = uVar30 + 1;
                        fVar46 = (float)local_118;
                      } while ((float)local_118 < local_f0);
                    }
                  }
                  uVar25 = uVar25 + 1;
                  uVar30 = local_40;
                } while (uVar25 != local_40);
              }
              std::
              _Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
              ::~_Rb_tree((_Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                           *)local_1a8);
              uVar25 = local_48;
              __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_158;
              uVar42 = uStack_154;
              uVar43 = uStack_150;
              uVar44 = uStack_14c;
              fVar40 = fVar45;
            } while (fVar45 < local_108);
          }
          if (local_1e8 != (pointer)0x0) {
            operator_delete(local_1e8,(long)local_1c8 - (long)local_1e8);
            __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_158;
            uVar42 = uStack_154;
            uVar43 = uStack_150;
            uVar44 = uStack_14c;
          }
          _Var32._M_current = local_80._M_current;
        } while ((float)__comp._M_comp.y < fVar4);
      }
      if (local_10c == LINE_END) {
        pRVar22 = local_138.
                  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_90;
        lVar26 = (long)_Var32._M_current - (long)local_1f8._M_current >> 5;
        _Var20._M_current = local_1f8._M_current;
        if (0 < lVar26) {
          _Var20._M_current =
               ((long)_Var32._M_current - (long)local_1f8._M_current & 0xffffffffffffffe0U) +
               local_1f8._M_current;
          lVar26 = lVar26 + 1;
          ppRVar18 = local_1f8._M_current + 2;
          do {
            if (ppRVar18[-2] == pRVar22) {
              ppRVar18 = ppRVar18 + -2;
              goto LAB_0010f590;
            }
            if (ppRVar18[-1] == pRVar22) {
              ppRVar18 = ppRVar18 + -1;
              goto LAB_0010f590;
            }
            if (*ppRVar18 == pRVar22) goto LAB_0010f590;
            if (ppRVar18[1] == pRVar22) {
              ppRVar18 = ppRVar18 + 1;
              goto LAB_0010f590;
            }
            lVar26 = lVar26 + -1;
            ppRVar18 = ppRVar18 + 4;
          } while (1 < lVar26);
        }
        lVar26 = (long)_Var32._M_current - (long)_Var20._M_current >> 3;
        if (lVar26 == 1) {
LAB_0010f4af:
          ppRVar18 = _Var20._M_current;
          if (*_Var20._M_current != pRVar22) {
            ppRVar18 = _Var32._M_current;
          }
        }
        else if (lVar26 == 2) {
LAB_0010f4a6:
          ppRVar18 = _Var20._M_current;
          if (*_Var20._M_current != pRVar22) {
            _Var20._M_current = _Var20._M_current + 1;
            goto LAB_0010f4af;
          }
        }
        else {
          ppRVar18 = _Var32._M_current;
          if ((lVar26 == 3) && (ppRVar18 = _Var20._M_current, *_Var20._M_current != pRVar22)) {
            _Var20._M_current = _Var20._M_current + 1;
            goto LAB_0010f4a6;
          }
        }
LAB_0010f590:
        __src = ppRVar18 + 1;
        local_158 = (float)__comp._M_comp.y;
        uStack_154 = uVar42;
        uStack_150 = uVar43;
        uStack_14c = uVar44;
        if (__src != _Var32._M_current) {
          memmove(ppRVar18,__src,(long)_Var32._M_current - (long)__src);
        }
        _Var32._M_current = _Var32._M_current + -1;
        __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_158;
        uVar42 = uStack_154;
        uVar43 = uStack_150;
        uVar44 = uStack_14c;
      }
      else if (local_10c == LINE_START) {
        pRVar22 = local_138.
                  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_90;
        if (_Var32._M_current == local_1d0) {
          __n_00 = (long)_Var32._M_current - (long)local_1f8._M_current;
          if (__n_00 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar30 = (long)__n_00 >> 3;
          uVar25 = uVar30;
          if (_Var32._M_current == local_1f8._M_current) {
            uVar25 = 1;
          }
          local_168 = (Shape *)(uVar25 + uVar30);
          if ((Shape *)0xffffffffffffffe < local_168) {
            local_168 = (Shape *)0xfffffffffffffff;
          }
          if (CARRY8(uVar25,uVar30)) {
            local_168 = (Shape *)0xfffffffffffffff;
          }
          if (local_168 == (Shape *)0x0) {
            ppRVar18 = (RasterizeLine **)0x0;
            local_158 = (float)__comp._M_comp.y;
            uStack_154 = uVar42;
            uStack_150 = uVar43;
            uStack_14c = uVar44;
          }
          else {
            local_158 = (float)__comp._M_comp.y;
            uStack_154 = uVar42;
            uStack_150 = uVar43;
            uStack_14c = uVar44;
            ppRVar18 = (RasterizeLine **)operator_new((long)local_168 * 8);
          }
          ppRVar18[uVar30] = pRVar22;
          if (0 < (long)__n_00) {
            memmove(ppRVar18,local_1f8._M_current,__n_00);
          }
          if (local_1f8._M_current != (RasterizeLine **)0x0) {
            operator_delete(local_1f8._M_current,(long)local_1d0 - (long)local_1f8._M_current);
          }
          _Var32._M_current = ppRVar18 + __n_00 + 8;
          local_1d0 = ppRVar18 + (long)local_168;
          local_1f8._M_current = ppRVar18;
          __comp._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_158;
          uVar42 = uStack_154;
          uVar43 = uStack_150;
          uVar44 = uStack_14c;
        }
        else {
          *_Var32._M_current = pRVar22;
          _Var32._M_current = _Var32._M_current + 1;
        }
      }
    } while (local_e8.c.
             super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_e8.c.
             super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  write_png(&local_c8,local_60);
  if (local_1f8._M_current != (RasterizeLine **)0x0) {
    operator_delete(local_1f8._M_current,(long)local_1d0 - (long)local_1f8._M_current);
  }
  if (local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.c.
                    super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.c.
                          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.c.
                          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.
      super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void rasterize(const std::vector<Shape>& shapes, const char* file_name, size_t width, size_t height) {
	// collect lines and events
	std::vector<RasterizeLine> lines;
	std::priority_queue<Event, std::vector<Event>, std::greater<Event>> events;
	for (const Shape& shape: shapes) {
		for (const Segment& s: shape.segments) {
			const size_t index = lines.size();
			if (s.y0 < s.y1) {
				lines.push_back(RasterizeLine(s.line, 1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y0, index));
				events.push(Event(Event::Type::LINE_END, s.y1, index));
			}
			else {
				lines.push_back(RasterizeLine(s.line, -1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y1, index));
				events.push(Event(Event::Type::LINE_END, s.y0, index));
			}
		}
	}

	Pixmap pixmap(width, height);

	float y = events.empty() ? 0.f : events.top().y;
	std::vector<const RasterizeLine*> current_lines;
	while (!events.empty()) {
		Event event = events.top();
		events.pop();
		while (y < event.y) {
			std::sort(current_lines.begin(), current_lines.end(), [y](const RasterizeLine* l0, const RasterizeLine* l1) {
				const float x0 = l0->get_x(y);
				const float x1 = l1->get_x(y);
				if (x0 == x1) {
					return l0->m < l1->m;
				}
				return x0 < x1;
			});
			float next_y = event.y;
			// find intersections
			for (size_t i = 1; i < current_lines.size(); ++i) {
				const RasterizeLine& l0 = *current_lines[i-1];
				const RasterizeLine& l1 = *current_lines[i];
				if (l0.m != l1.m) {
					const float intersection = intersect(l0, l1);
					if (y < intersection && intersection < next_y) {
						next_y = intersection;
					}
				}
			}
			Strip strip(y, next_y);
			for (const RasterizeLine* line: current_lines) {
				strip.lines.push_back(*line);
			}
			rasterize_strip(strip, pixmap);
			y = next_y;
		}
		switch (event.type) {
		case Event::Type::LINE_START:
			current_lines.push_back(&lines[event.index]);
			break;
		case Event::Type::LINE_END:
			current_lines.erase(std::find(current_lines.begin(), current_lines.end(), &lines[event.index]));
			break;
		}
	}

	write_png(pixmap, file_name);
}